

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall
fasttext::FastText::trainThread(FastText *this,int32_t threadId,TrainCallback *callback)

{
  model_name mVar1;
  int32_t iVar2;
  void *__tmp;
  int64_t iVar3;
  element_type *peVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  real rVar9;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  State state;
  ifstream ifs;
  vector<int,_std::allocator<int>_> local_2e8;
  tuple<long,_double,_double> local_2d0;
  vector<int,_std::allocator<int>_> local_2b8;
  State local_298;
  ifstream local_238 [520];
  
  std::ifstream::ifstream
            (local_238,
             (string *)
             &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->input,_S_in);
  iVar3 = utils::size(local_238);
  utils::seek(local_238,
              (iVar3 * threadId) /
              (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->thread);
  iVar2 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dim
  ;
  iVar3 = Matrix::size((this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  Model::State::State(&local_298,iVar2,(int32_t)iVar3,
                      ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->seed + threadId);
  iVar3 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (((this->tokenCount_).super___atomic_base<long>._M_i <
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->epoch
       * iVar3) && ((this->trainException_)._M_exception_object == (void *)0x0)) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      fVar8 = (float)(this->tokenCount_).super___atomic_base<long>._M_i /
              (float)(peVar4->epoch * iVar3);
      uVar6 = uVar5;
      if (((callback->super__Function_base)._M_manager != (_Manager_type)0x0) &&
         (uVar6 = uVar5 + 1, (uVar5 & 0x3f) == 0)) {
        progressInfo(&local_2d0,this,fVar8);
        std::function<void_(float,_float,_double,_double,_long)>::operator()
                  (callback,fVar8,(this->loss_)._M_i,
                   (double)local_2d0.super__Tuple_impl<0UL,_long,_double,_double>.
                           super__Head_base<0UL,_long,_false>._M_head_impl,
                   local_2d0.super__Tuple_impl<0UL,_long,_double,_double>.
                   super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>.
                   _M_head_impl,
                   (long)(double)local_2d0.super__Tuple_impl<0UL,_long,_double,_double>.
                                 super__Tuple_impl<1UL,_double,_double>.
                                 super__Tuple_impl<2UL,_double>.super__Head_base<2UL,_double,_false>
                                 ._M_head_impl);
        peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
      }
      mVar1 = peVar4->model;
      fVar8 = (float)((1.0 - (double)fVar8) * peVar4->lr);
      if (mVar1 == cbow) {
        iVar2 = Dictionary::getLine((this->dict_).
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(istream *)local_238,&local_2b8,&local_298.rng);
        cbow(this,&local_298,fVar8,&local_2b8);
LAB_0013136b:
        lVar7 = lVar7 + iVar2;
      }
      else {
        if (mVar1 == sg) {
          iVar2 = Dictionary::getLine((this->dict_).
                                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(istream *)local_238,&local_2b8,&local_298.rng);
          skipgram(this,&local_298,fVar8,&local_2b8);
          goto LAB_0013136b;
        }
        if (mVar1 == sup) {
          iVar2 = Dictionary::getLine((this->dict_).
                                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(istream *)local_238,&local_2b8,&local_2e8);
          supervised(this,&local_298,fVar8,&local_2b8,&local_2e8);
          goto LAB_0013136b;
        }
      }
      if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          lrUpdateRate < lVar7) {
        LOCK();
        (this->tokenCount_).super___atomic_base<long>._M_i =
             (this->tokenCount_).super___atomic_base<long>._M_i + lVar7;
        UNLOCK();
        if ((threadId == 0) &&
           (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->verbose)) {
          rVar9 = Model::State::getLoss(&local_298);
          LOCK();
          (this->loss_)._M_i = rVar9;
          UNLOCK();
        }
        lVar7 = 0;
      }
    } while (((this->tokenCount_).super___atomic_base<long>._M_i <
              ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->epoch * iVar3) &&
            (uVar5 = uVar6, (this->trainException_)._M_exception_object == (void *)0x0));
  }
  if (threadId == 0) {
    rVar9 = Model::State::getLoss(&local_298);
    LOCK();
    (this->loss_)._M_i = rVar9;
    UNLOCK();
  }
  std::ifstream::close();
  if (local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.grad.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.grad.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.output.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.output.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_298.hidden.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.hidden.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId, const TrainCallback& callback) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model::State state(args_->dim, output_->size(0), threadId + args_->seed);

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  uint64_t callbackCounter = 0;
  try {
    while (keepTraining(ntokens)) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      if (callback && ((callbackCounter++ % 64) == 0)) {
        double wst;
        double lr;
        int64_t eta;
        std::tie<double, double, int64_t>(wst, lr, eta) =
            progressInfo(progress);
        callback(progress, loss_, wst, lr, eta);
      }
      real lr = args_->lr * (1.0 - progress);
      if (args_->model == model_name::sup) {
        localTokenCount += dict_->getLine(ifs, line, labels);
        supervised(state, lr, line, labels);
      } else if (args_->model == model_name::cbow) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        cbow(state, lr, line);
      } else if (args_->model == model_name::sg) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        skipgram(state, lr, line);
      }
      if (localTokenCount > args_->lrUpdateRate) {
        tokenCount_ += localTokenCount;
        localTokenCount = 0;
        if (threadId == 0 && args_->verbose > 1) {
          loss_ = state.getLoss();
        }
      }
    }
  } catch (DenseMatrix::EncounteredNaNError&) {
    trainException_ = std::current_exception();
  }
  if (threadId == 0)
    loss_ = state.getLoss();
  ifs.close();
}